

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_sampler_skip.cpp
# Opt level: O2

void kokkosp_begin_parallel_for(char *name,uint32_t devID,uint64_t *kID)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  
  lVar1 = KokkosTools::Sampler::uniqID + 1;
  *kID = KokkosTools::Sampler::uniqID;
  KokkosTools::Sampler::uniqID = lVar1;
  KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum =
       KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum + 1;
  if (KokkosTools::Sampler::kokkosp_begin_parallel_for::invocationNum %
      KokkosTools::Sampler::kernelSampleSkip == 0) {
    iVar2 = rand();
    auVar4._0_8_ = (double)iVar2;
    auVar4._8_8_ = KokkosTools::Sampler::tool_prob_num;
    auVar4 = divpd(auVar4,_DAT_00106010);
    if ((auVar4._0_8_ < auVar4._8_8_) && (KokkosTools::Sampler::beginForCallee != (code *)0x0)) {
      if (0 < KokkosTools::Sampler::tool_verbosity) {
        poVar3 = std::operator<<((ostream *)&std::cout,"KokkosP: sample ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," calling child-begin function...\n");
      }
      if (KokkosTools::Sampler::tool_globFence != 0) {
        KokkosTools::Sampler::invoke_ktools_fence(0);
      }
      (*KokkosTools::Sampler::beginForCallee)(name,devID);
      if (0 < KokkosTools::Sampler::tool_verbosity) {
        poVar3 = std::operator<<((ostream *)&std::cout,"KokkosP: sample ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," finished with child-begin function.\n");
      }
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long_const,unsigned_long>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)KokkosTools::Sampler::infokIDSample);
    }
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char* name, const uint32_t devID,
                                uint64_t* kID) {
  *kID                          = uniqID++;
  static uint64_t invocationNum = 0;
  ++invocationNum;
  if ((invocationNum % kernelSampleSkip) == 0) {
    if ((rand() / (1.0 * RAND_MAX)) < (tool_prob_num / 100.0)) {
      if (NULL != beginForCallee) {
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " calling child-begin function...\n";
        }
        if (tool_globFence) {
          invoke_ktools_fence(0);
        }
        uint64_t nestedkID = 0;
        (*beginForCallee)(name, devID, &nestedkID);
        if (tool_verbosity > 0) {
          std::cout << "KokkosP: sample " << *kID
                    << " finished with child-begin function.\n";
        }
        infokIDSample.insert({*kID, nestedkID});
      }
    }
  }
}